

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

void * nghttp2_session_get_stream_user_data(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  void *pvVar2;
  
  pnVar1 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar1 == (nghttp2_stream *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = pnVar1->stream_user_data;
  }
  return pvVar2;
}

Assistant:

void *nghttp2_session_get_stream_user_data(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    return stream->stream_user_data;
  } else {
    return NULL;
  }
}